

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O3

Aig_Obj_t * Aig_Oper(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1,Aig_Type_t Type)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  
  if (Type != AIG_OBJ_EXOR) {
    if (Type == AIG_OBJ_AND) {
      pAVar1 = Aig_And(p,p0,p1);
      return pAVar1;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigOper.c"
                  ,0x59,"Aig_Obj_t *Aig_Oper(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)");
  }
  if (p0 == p1) {
    pAVar1 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
  }
  else if ((Aig_Obj_t *)((ulong)p1 ^ 1) == p0) {
    pAVar1 = p->pConst1;
  }
  else {
    pAVar3 = (Aig_Obj_t *)((ulong)p0 & 0xfffffffffffffffe);
    pAVar1 = p->pConst1;
    if (pAVar1 == pAVar3) {
      pAVar1 = (Aig_Obj_t *)((ulong)(pAVar3 == p0) ^ (ulong)p1);
    }
    else {
      pAVar2 = (Aig_Obj_t *)((ulong)p1 & 0xfffffffffffffffe);
      if (pAVar1 == pAVar2) {
        pAVar1 = (Aig_Obj_t *)((ulong)(pAVar1 == p1) ^ (ulong)p0);
      }
      else {
        if (p->fCatchExor == 0) {
          pAVar1 = Aig_And(p,p0,(Aig_Obj_t *)((ulong)p1 ^ 1));
          pAVar3 = Aig_And(p,(Aig_Obj_t *)((ulong)p0 ^ 1),p1);
          pAVar1 = Aig_Or(p,pAVar1,pAVar3);
          return pAVar1;
        }
        pAVar1 = pAVar2;
        if (pAVar2 == (Aig_Obj_t *)0x0) {
          if (pAVar3 == (Aig_Obj_t *)0x0) goto LAB_006089d6;
          *(ulong *)&(p->Ghost).field_0x18 =
               *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 6;
        }
        else {
          if ((*(uint *)&pAVar2->field_0x18 & 7) == 1) {
            __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x15e,
                          "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                         );
          }
          if (pAVar3 == pAVar2) {
LAB_006089d6:
            __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x15f,
                          "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                         );
          }
          *(ulong *)&(p->Ghost).field_0x18 =
               *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 6;
          if (pAVar2->Id <= pAVar3->Id) {
            pAVar1 = pAVar3;
            pAVar3 = pAVar2;
          }
        }
        (p->Ghost).pFanin0 = pAVar3;
        (p->Ghost).pFanin1 = pAVar1;
        pAVar1 = Aig_TableLookup(p,&p->Ghost);
        if (pAVar1 == (Aig_Obj_t *)0x0) {
          pAVar1 = Aig_ObjCreate(p,&p->Ghost);
        }
        pAVar1 = (Aig_Obj_t *)((ulong)(((uint)p1 ^ (uint)p0) & 1) ^ (ulong)pAVar1);
      }
    }
  }
  return pAVar1;
}

Assistant:

Aig_Obj_t * Aig_Oper( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1, Aig_Type_t Type )
{
    if ( Type == AIG_OBJ_AND )
        return Aig_And( p, p0, p1 );
    if ( Type == AIG_OBJ_EXOR )
        return Aig_Exor( p, p0, p1 );
    assert( 0 );
    return NULL;
}